

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O3

void qpdfjob_register_progress_reporter
               (qpdfjob_handle j,_func_void_int_void_ptr *report_progress,void *data)

{
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x10);
  *(_func_void_int_void_ptr **)local_40._M_unused._0_8_ = report_progress;
  *(void **)((long)local_40._M_unused._0_8_ + 8) = data;
  local_28 = std::
             _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
             ::_M_manager;
  QPDFJob::registerProgressReporter(&j->j,(function<void_(int)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdfjob_register_progress_reporter(
    qpdfjob_handle j, void (*report_progress)(int percent, void* data), void* data)
{
    j->j.registerProgressReporter(std::bind(report_progress, std::placeholders::_1, data));
}